

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *local_48;
  bool local_3b;
  byte local_3a;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  byte local_19;
  ImGuiWindow *pIStack_18;
  bool is_closed_popup;
  ImGuiWindow *root_window;
  ImGuiContext *g;
  
  root_window = (ImGuiWindow *)GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      pIStack_18 = GImGui->HoveredRootWindow;
      local_3a = 0;
      if ((pIStack_18 != (ImGuiWindow *)0x0) &&
         (local_3a = 0, (pIStack_18->Flags & 0x4000000U) != 0)) {
        bVar1 = IsPopupOpen(pIStack_18->PopupId,0x100);
        local_3a = bVar1 ^ 0xff;
      }
      local_19 = local_3a & 1;
      if ((pIStack_18 == (ImGuiWindow *)0x0) || (local_19 != 0)) {
        if ((pIStack_18 == (ImGuiWindow *)0x0) &&
           ((*(long *)&root_window[7].DC.LastItemRect.Max.y != 0 &&
            (pIVar2 = GetTopMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)))) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow((ImGuiWindow *)root_window[6].DrawListInst._Splitter._Channels.Data);
        if ((((root_window->IDStack).Capacity & 1) != 0) && ((pIStack_18->Flags & 1U) == 0)) {
          join_0x00001240_0x00001200_ = ImGuiWindow::TitleBarRect(pIStack_18);
          bVar1 = ImRect::Contains((ImRect *)((long)&modal + 4),
                                   (ImVec2 *)&root_window->NavRectRel[1].Min.y);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            root_window[6].RootWindow = (ImGuiWindow *)0x0;
          }
        }
        if ((*(byte *)((long)root_window[6].NavLastIds + 7) & 1) != 0) {
          root_window[6].RootWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if (((uint)root_window[1].ContentSizeExplicit.x & 0x100) != 0) {
      local_48 = GetTopMostPopupModal();
      local_3b = false;
      if (root_window[6].DrawListInst._Splitter._Channels.Data != (ImDrawChannel *)0x0) {
        local_3b = IsWindowAbove((ImGuiWindow *)root_window[6].DrawListInst._Splitter._Channels.Data
                                 ,local_48);
      }
      if (local_3b != false) {
        local_48 = (ImGuiWindow *)root_window[6].DrawListInst._Splitter._Channels.Data;
      }
      ClosePopupsOverWindow(local_48,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}